

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin.cpp
# Opt level: O3

string * __thiscall
flatbuffers::kotlin::KotlinGenerator::LiteralSuffix_abi_cxx11_
          (string *__return_storage_ptr__,KotlinGenerator *this,BaseType type)

{
  char *pcVar1;
  uint uVar2;
  char *pcVar3;
  
  uVar2 = (uint)this;
  if (uVar2 < 0xb) {
    if ((0x152U >> (uVar2 & 0x1f) & 1) != 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = "u";
      pcVar1 = "";
      goto LAB_001d993d;
    }
    if (uVar2 == 9) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = "L";
      pcVar1 = "";
      goto LAB_001d993d;
    }
    if (uVar2 == 10) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = "UL";
      pcVar1 = "";
      goto LAB_001d993d;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = "";
  pcVar3 = pcVar1;
LAB_001d993d:
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

static std::string LiteralSuffix(const BaseType type) {
    switch (type) {
      case BASE_TYPE_UINT:
      case BASE_TYPE_UCHAR:
      case BASE_TYPE_UTYPE:
      case BASE_TYPE_USHORT: return "u";
      case BASE_TYPE_ULONG: return "UL";
      case BASE_TYPE_LONG: return "L";
      default: return "";
    }
  }